

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O0

void QtPromisePrivate::PromiseFulfill<QtPromise::QPromise<bool>>::
     call<QtPromise::QPromiseResolve<bool>,QtPromise::QPromiseReject<bool>>
               (QPromise<bool> *promise,QPromiseResolve<bool> *resolve,QPromiseReject<bool> *reject)

{
  QPromiseReject<bool> *pQVar1;
  QPromiseResolve<bool> *fulfilled;
  bool bVar2;
  PromiseValue<bool> *value;
  PromiseData<bool> *pPVar3;
  PromiseError *error;
  QPromiseReject<bool> local_70;
  QPromise<bool> local_68 [2];
  anon_class_24_2_d74e9aa7 local_48;
  QPromiseBase<bool> local_30;
  QPromiseReject<bool> *local_20;
  QPromiseReject<bool> *reject_local;
  QPromiseResolve<bool> *resolve_local;
  QPromise<bool> *promise_local;
  
  local_20 = reject;
  reject_local = (QPromiseReject<bool> *)resolve;
  resolve_local = (QPromiseResolve<bool> *)promise;
  bVar2 = QtPromise::QPromiseBase<bool>::isFulfilled(&promise->super_QPromiseBase<bool>);
  pQVar1 = reject_local;
  if (bVar2) {
    pPVar3 = QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<bool>_>::operator->
                       ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<bool>_> *)
                        (resolve_local + 1));
    value = PromiseData<bool>::value(pPVar3);
    QtPromise::QPromiseResolve<bool>::operator()((QPromiseResolve<bool> *)pQVar1,value);
  }
  else {
    bVar2 = QtPromise::QPromiseBase<bool>::isRejected((QPromiseBase<bool> *)resolve_local);
    fulfilled = resolve_local;
    pQVar1 = local_20;
    if (bVar2) {
      pPVar3 = QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<bool>_>::operator->
                         ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<bool>_> *)
                          (resolve_local + 1));
      error = PromiseDataBase<bool,_void_(const_bool_&)>::error
                        (&pPVar3->super_PromiseDataBase<bool,_void_(const_bool_&)>);
      QtPromise::QPromiseReject<bool>::operator()(pQVar1,error);
    }
    else {
      QtPromise::QPromiseResolve<bool>::QPromiseResolve
                ((QPromiseResolve<bool> *)&local_48,(QPromiseResolve<bool> *)reject_local);
      QtPromise::QPromise<bool>::QPromise(&local_48.promise,(QPromise<bool> *)resolve_local);
      QtPromise::QPromiseReject<bool>::QPromiseReject(&local_70,local_20);
      QtPromise::QPromise<bool>::QPromise(local_68,(QPromise<bool> *)resolve_local);
      QtPromise::QPromiseBase<bool>::
      then<QtPromisePrivate::PromiseFulfill<QtPromise::QPromise<bool>>::call<QtPromise::QPromiseResolve<bool>,QtPromise::QPromiseReject<bool>>(QtPromise::QPromise<bool>const&,QtPromise::QPromiseResolve<bool>const&,QtPromise::QPromiseReject<bool>const&)::_lambda()_1_,QtPromisePrivate::PromiseFulfill<QtPromise::QPromise<bool>>::call<QtPromise::QPromiseResolve<bool>,QtPromise::QPromiseReject<bool>>(QtPromise::QPromise<bool>const&,QtPromise::QPromiseResolve<bool>const&,QtPromise::QPromiseReject<bool>const&)::_lambda()_2_>
                (&local_30,(anon_class_24_2_e6a34898 *)fulfilled,&local_48);
      QtPromise::QPromise<void>::~QPromise((QPromise<void> *)&local_30);
      call<QtPromise::QPromiseResolve<bool>,QtPromise::QPromiseReject<bool>>(QtPromise::QPromise<bool>const&,QtPromise::QPromiseResolve<bool>const&,QtPromise::QPromiseReject<bool>const&)
      ::{lambda()#2}::~call((_lambda___2_ *)&local_70);
      call<QtPromise::QPromiseResolve<bool>,QtPromise::QPromiseReject<bool>>(QtPromise::QPromise<bool>const&,QtPromise::QPromiseResolve<bool>const&,QtPromise::QPromiseReject<bool>const&)
      ::{lambda()#1}::~call((_lambda___1_ *)&local_48);
    }
  }
  return;
}

Assistant:

static void
    call(const QtPromise::QPromise<T>& promise, const TResolve& resolve, const TReject& reject)
    {
        if (promise.isFulfilled()) {
            resolve(promise.m_d->value());
        } else if (promise.isRejected()) {
            reject(promise.m_d->error());
        } else {
            promise.then(
                [=]() {
                    resolve(promise.m_d->value());
                },
                [=]() { // catch all
                    reject(promise.m_d->error());
                });
        }
    }